

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O1

int NetbufferSize(void)

{
  uint uVar1;
  uint count;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  BYTE *skipper;
  BYTE *local_20;
  
  if ((doomcom.data[0] & 0xa0) != 0) {
    return (int)doomcom.datalength;
  }
  uVar1 = 3 - (doomcom.data[0] < 0x40);
  if (NetMode == '\x01') {
    uVar1 = uVar1 + (nodeforplayer[Net_Arbitrator] == (int)doomcom.remotenode);
  }
  count = doomcom.data[0] & 3;
  if (count == 3) {
    uVar2 = (ulong)uVar1;
    uVar1 = uVar1 + 1;
    count = doomcom.data[uVar2] + 3;
  }
  if ((doomcom.data[0] & 8) != 0) {
    uVar1 = uVar1 + doomcom.data[uVar1] + 1;
  }
  uVar2 = (ulong)uVar1 + 1;
  uVar3 = 1;
  if ((doomcom.data[0] & 0x10) != 0) {
    uVar3 = (uint)doomcom.data[(ulong)uVar1 + 1];
    uVar2 = (ulong)((int)uVar2 + (uint)doomcom.data[(ulong)uVar1 + 1]);
  }
  local_20._0_4_ = count * uVar3 * 3 + (int)uVar2;
  if ((int)local_20 <= doomcom.datalength) {
    local_20 = doomcom.data + (uVar2 & 0xffffffff);
    if ((-1 < (char)doomcom.data[0]) && (uVar3 != 0)) {
      iVar4 = uVar3 + 1;
      do {
        SkipTicCmd(&local_20,count);
        iVar4 = iVar4 + -1;
      } while (1 < iVar4);
    }
    local_20._0_4_ = (int)local_20 + -0xa2adb4;
  }
  return (int)local_20;
}

Assistant:

int NetbufferSize ()
{
	if (netbuffer[0] & (NCMD_EXIT | NCMD_SETUP))
	{
		return doomcom.datalength;
	}

	int k = 2, count, numtics;

	if (netbuffer[0] & NCMD_RETRANSMIT)
		k++;

	if (NetMode == NET_PacketServer && doomcom.remotenode == nodeforplayer[Net_Arbitrator])
		k++;

	numtics = netbuffer[0] & NCMD_XTICS;
	if (numtics == 3)
	{
		numtics += netbuffer[k++];
	}

	if (netbuffer[0] & NCMD_QUITTERS)
	{
		k += netbuffer[k] + 1;
	}

	// Network delay byte
	k++;

	if (netbuffer[0] & NCMD_MULTI)
	{
		count = netbuffer[k];
		k += count;
	}
	else
	{
		count = 1;
	}

	// Need at least 3 bytes per tic per player
	if (doomcom.datalength < k + 3 * count * numtics)
	{
		return k + 3 * count * numtics;
	}

	BYTE *skipper = &netbuffer[k];
	if ((netbuffer[0] & NCMD_EXIT) == 0)
	{
		while (count-- > 0)
		{
			SkipTicCmd (&skipper, numtics);
		}
	}
	return int(skipper - netbuffer);
}